

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_info.hpp
# Opt level: O0

void __thiscall
chaiscript::Type_Info::Type_Info
          (Type_Info *this,bool t_is_const,bool t_is_reference,bool t_is_pointer,bool t_is_void,
          bool t_is_arithmetic,type_info *t_ti,type_info *t_bare_ti)

{
  bool t_is_arithmetic_local;
  bool t_is_void_local;
  bool t_is_pointer_local;
  bool t_is_reference_local;
  bool t_is_const_local;
  Type_Info *this_local;
  
  this->m_type_info = t_ti;
  this->m_bare_type_info = t_bare_ti;
  this->m_flags =
       (uint)t_is_const + (uint)t_is_reference * 2 + (uint)t_is_pointer * 4 + (uint)t_is_void * 8 +
       (uint)t_is_arithmetic * 0x10;
  return;
}

Assistant:

constexpr Type_Info(const bool t_is_const,
                        const bool t_is_reference,
                        const bool t_is_pointer,
                        const bool t_is_void,
                        const bool t_is_arithmetic,
                        const std::type_info *t_ti,
                        const std::type_info *t_bare_ti) noexcept
        : m_type_info(t_ti)
        , m_bare_type_info(t_bare_ti)
        , m_flags((static_cast<unsigned int>(t_is_const) << is_const_flag) + (static_cast<unsigned int>(t_is_reference) << is_reference_flag)
                  + (static_cast<unsigned int>(t_is_pointer) << is_pointer_flag) + (static_cast<unsigned int>(t_is_void) << is_void_flag)
                  + (static_cast<unsigned int>(t_is_arithmetic) << is_arithmetic_flag)) {
    }